

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O2

double insphereadapt(double *pa,double *pb,double *pc,double *pd,double *pe,double permanent)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  double b;
  double b_00;
  double dVar12;
  double dVar15;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double b_01;
  double dVar16;
  double dVar17;
  double dVar18;
  double b_02;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double b_03;
  double dVar23;
  double b_04;
  double dVar26;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double b_05;
  double b_06;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double local_8208;
  double dStack_8170;
  double local_8148;
  double dStack_80f0;
  double dStack_80d0;
  double dStack_8000;
  double local_7f78;
  double dStack_7f70;
  double local_7f68;
  double dStack_7f60;
  double local_7f58;
  double dStack_7f50;
  double local_7f48;
  double local_7f40;
  double local_7f38;
  double dStack_7f30;
  undefined1 local_7f28 [16];
  double temp8c [8];
  double temp8b [8];
  double temp8a [8];
  undefined1 local_7e58 [16];
  double local_7e48;
  double local_7e40;
  double local_7e38;
  double dStack_7e30;
  double local_7e28;
  double dStack_7e20;
  undefined1 local_7e18 [16];
  double local_7e08;
  double local_7e00;
  double temp16 [16];
  double temp24 [24];
  double xdet [96];
  double temp48 [48];
  double zdet [96];
  double ydet [96];
  double xydet [192];
  double cdet [288];
  double bdet [288];
  double adet [288];
  double ddet [288];
  double cddet [576];
  double abdet [576];
  double fin1 [1152];
  
  dVar36 = *pd;
  auVar14 = *(undefined1 (*) [16])pe;
  dVar38 = *pb;
  dVar47 = pb[1];
  dVar51 = *pa;
  dVar64 = auVar14._0_8_;
  b = dVar36 - dVar64;
  dVar39 = auVar14._8_8_;
  dVar59 = *pc;
  dVar61 = pc[1];
  b_05 = dVar59 - dVar64;
  b_06 = dVar61 - dVar39;
  auVar25._8_4_ = auVar14._0_4_;
  auVar25._0_8_ = dVar64;
  auVar25._12_4_ = auVar14._4_4_;
  b_01 = dVar38 - dVar64;
  b_02 = dVar51 - dVar64;
  dVar54 = pa[1];
  b_03 = dVar47 - dVar39;
  b_04 = dVar54 - dVar39;
  dVar67 = b_04 * splitter - (b_04 * splitter - b_04);
  dVar69 = b_03 * splitter - (b_03 * splitter - b_03);
  dVar42 = b_05 * splitter - (b_05 * splitter - b_05);
  dVar43 = b_01 * splitter - (b_01 * splitter - b_01);
  dVar57 = pd[1];
  b_00 = dVar57 - dVar39;
  dVar62 = b_00 * splitter - (b_00 * splitter - b_00);
  dVar63 = b_06 * splitter - (b_06 * splitter - b_06);
  dVar12 = splitter * b_02 - (splitter * b_02 - b_02);
  dVar15 = splitter * b - (splitter * b - b);
  dVar23 = b_03 * b_02;
  dVar26 = b * b_04;
  dVar31 = b_02 - dVar12;
  dVar33 = b - dVar15;
  dVar52 = b_04 - dVar67;
  dVar55 = b_03 - dVar69;
  dVar16 = dVar55 * dVar31 - (((dVar23 - dVar12 * dVar69) - dVar69 * dVar31) - dVar12 * dVar55);
  dVar19 = dVar52 * dVar33 - (((dVar26 - dVar15 * dVar67) - dVar67 * dVar33) - dVar15 * dVar52);
  dVar27 = b_05 - dVar42;
  dVar29 = b_01 - dVar43;
  dVar17 = -dVar42;
  dVar20 = -dVar43;
  dVar21 = -dVar29;
  dVar12 = -dVar12;
  dVar15 = -dVar15;
  dVar35 = b_02 * b_00;
  dVar37 = b_04 * b_01;
  auVar14._8_4_ = SUB84(dVar31,0);
  auVar14._0_8_ = dVar21;
  auVar14._12_4_ = (int)((ulong)-dVar31 >> 0x20);
  auVar1._8_4_ = SUB84(dVar69,0);
  auVar1._0_8_ = dVar63;
  auVar1._12_4_ = (int)((ulong)dVar69 >> 0x20);
  auVar2._8_4_ = SUB84(dVar15 * dVar69,0);
  auVar2._0_8_ = dVar17 * dVar67;
  auVar2._12_4_ = (int)((ulong)(dVar15 * dVar69) >> 0x20);
  dVar68 = b_00 - dVar62;
  dVar70 = b_06 - dVar63;
  dVar32 = dVar52 * dVar29 - (dVar20 * dVar52 + dVar67 * dVar21 + dVar20 * dVar67 + dVar37);
  dVar34 = dVar68 * dVar31 - (dVar12 * dVar68 + dVar62 * -dVar31 + dVar12 * dVar62 + dVar35);
  dVar40 = dVar16 - dVar32;
  dVar41 = dVar19 - dVar34;
  dVar53 = dVar23 + dVar40;
  dVar56 = dVar26 + dVar41;
  dVar23 = (dVar23 - (dVar53 - (dVar53 - dVar23))) + (dVar40 - (dVar53 - dVar23));
  dVar44 = (dVar26 - (dVar56 - (dVar56 - dVar26))) + (dVar41 - (dVar56 - dVar26));
  dVar28 = dVar23 - dVar37;
  dVar30 = dVar44 - dVar35;
  local_7f38 = (dVar16 - (dVar40 + (dVar16 - dVar40))) + ((dVar16 - dVar40) - dVar32);
  dStack_7f30 = (dVar23 - (dVar28 + (dVar23 - dVar28))) + ((dVar23 - dVar28) - dVar37);
  dVar37 = pb[2];
  dVar16 = pa[2];
  dVar40 = pd[2];
  dVar23 = pc[2];
  dVar26 = pe[2];
  dVar18 = dVar53 + dVar28;
  dVar22 = dVar56 + dVar30;
  local_7f28._8_4_ = SUB84(dVar18,0);
  local_7f28._0_8_ = (dVar53 - (dVar18 - (dVar18 - dVar53))) + (dVar28 - (dVar18 - dVar53));
  local_7f28._12_4_ = (int)((ulong)dVar18 >> 0x20);
  dVar46 = b_00 * b_05;
  dVar48 = b_01 * b_06;
  dVar53 = dVar27 * dVar68 - (((dVar46 - dVar42 * dVar62) - dVar27 * dVar62) - dVar42 * dVar68);
  dVar45 = dVar29 * dVar70 - (((dVar48 - dVar43 * dVar63) - dVar29 * dVar63) - dVar43 * dVar70);
  dStack_80d0 = auVar1._8_8_;
  dVar28 = b_05 * b_03;
  dVar43 = b_06 * b;
  dVar65 = dVar33 * dVar70 - (dVar15 * dVar70 + -dVar33 * dVar63 + dVar15 * dVar63 + dVar43);
  dVar66 = dVar27 * dVar55 -
           (dVar17 * dVar55 + -dVar27 * dStack_80d0 + dVar17 * dStack_80d0 + dVar28);
  dVar58 = dVar53 - dVar65;
  dVar60 = dVar45 - dVar66;
  dVar32 = dVar46 + dVar58;
  dVar42 = dVar48 + dVar60;
  dVar46 = (dVar46 - (dVar32 - (dVar32 - dVar46))) + (dVar58 - (dVar32 - dVar46));
  dVar49 = (dVar48 - (dVar42 - (dVar42 - dVar48))) + (dVar60 - (dVar42 - dVar48));
  dVar48 = dVar46 - dVar43;
  dVar50 = dVar49 - dVar28;
  dVar28 = (dVar49 - (dVar50 + (dVar49 - dVar50))) + ((dVar49 - dVar50) - dVar28);
  local_7e18._8_4_ = SUB84(dVar28,0);
  local_7e18._0_8_ = (dVar45 - (dVar60 + (dVar45 - dVar60))) + ((dVar45 - dVar60) - dVar66);
  local_7e18._12_4_ = (int)((ulong)dVar28 >> 0x20);
  dVar45 = dVar32 + dVar48;
  dVar49 = dVar42 + dVar50;
  local_7e08 = (dVar42 - (dVar49 - (dVar49 - dVar42))) + (dVar50 - (dVar49 - dVar42));
  local_7e38 = (dVar53 - (dVar58 + (dVar53 - dVar58))) + ((dVar53 - dVar58) - dVar65);
  dStack_7e30 = (dVar46 - (dVar48 + (dVar46 - dVar48))) + ((dVar46 - dVar48) - dVar43);
  local_7e28 = (dVar32 - (dVar45 - (dVar45 - dVar32))) + (dVar48 - (dVar45 - dVar32));
  local_7f58 = (dVar19 - (dVar41 + (dVar19 - dVar41))) + ((dVar19 - dVar41) - dVar34);
  dStack_7f50 = (dVar44 - (dVar30 + (dVar44 - dVar30))) + ((dVar44 - dVar30) - dVar35);
  local_7f48 = (dVar56 - (dVar22 - (dVar22 - dVar56))) + (dVar30 - (dVar22 - dVar56));
  dVar28 = b_02 * b_06;
  dVar32 = b_00 * b_01;
  dStack_80f0 = auVar14._8_8_;
  dVar30 = dVar29 * dVar68 - (dVar20 * dVar68 + dVar21 * dVar62 + dVar20 * dVar62 + dVar32);
  dVar31 = dVar31 * dVar70 - (dVar12 * dVar70 + dStack_80f0 * dVar63 + dVar12 * dVar63 + dVar28);
  dVar19 = b_05 * b_04;
  dVar20 = b_03 * b;
  dStack_8170 = auVar2._8_8_;
  dVar27 = dVar27 * dVar52 - (dVar17 * dVar52 + -dVar27 * dVar67 + dVar17 * dVar67 + dVar19);
  dVar29 = dVar33 * dVar55 - (dVar15 * dVar55 + -dVar33 * dVar69 + dStack_8170 + dVar20);
  dVar21 = dVar31 - dVar27;
  dVar43 = dVar30 - dVar29;
  dVar15 = dVar28 + dVar21;
  dVar42 = dVar32 + dVar43;
  dVar12 = (dVar28 - (dVar15 - (dVar15 - dVar28))) + (dVar21 - (dVar15 - dVar28));
  dVar28 = (dVar32 - (dVar42 - (dVar42 - dVar32))) + (dVar43 - (dVar42 - dVar32));
  dVar32 = dVar12 - dVar19;
  dVar17 = dVar28 - dVar20;
  local_7f78 = (dVar31 - (dVar21 + (dVar31 - dVar21))) + ((dVar31 - dVar21) - dVar27);
  dStack_7f70 = (dVar12 - (dVar32 + (dVar12 - dVar32))) + ((dVar12 - dVar32) - dVar19);
  dVar19 = dVar15 + dVar32;
  dVar21 = dVar42 + dVar17;
  local_7f68 = (dVar15 - (dVar19 - (dVar19 - dVar15))) + (dVar32 - (dVar19 - dVar15));
  dVar12 = (dVar28 - (dVar17 + (dVar28 - dVar17))) + ((dVar28 - dVar17) - dVar20);
  local_7e58._8_4_ = SUB84(dVar12,0);
  local_7e58._0_8_ = (dVar30 - (dVar43 + (dVar30 - dVar43))) + ((dVar30 - dVar43) - dVar29);
  local_7e58._12_4_ = (int)((ulong)dVar12 >> 0x20);
  local_7e48 = (dVar42 - (dVar21 - (dVar21 - dVar42))) + (dVar17 - (dVar21 - dVar42));
  dVar28 = dVar37 - dVar26;
  auVar3._8_4_ = SUB84(dVar16 - dVar26,0);
  auVar3._0_8_ = dVar28;
  auVar3._12_4_ = (int)((ulong)(dVar16 - dVar26) >> 0x20);
  dVar32 = dVar40 - dVar26;
  dVar42 = dVar23 - dVar26;
  dStack_7f60 = dVar19;
  local_7f40 = dVar22;
  local_7e40 = dVar21;
  dStack_7e20 = dVar45;
  local_7e00 = dVar49;
  iVar6 = scale_expansion_zeroelim(4,&local_7e38,dVar28,temp8a);
  local_8148 = -dVar42;
  iVar7 = scale_expansion_zeroelim(4,(double *)local_7e58,-dVar42,temp8b);
  iVar8 = scale_expansion_zeroelim(4,(double *)local_7e18,dVar32,temp8c);
  iVar6 = fast_expansion_sum_zeroelim(iVar6,temp8a,iVar7,temp8b,temp16);
  iVar6 = fast_expansion_sum_zeroelim(iVar8,temp8c,iVar6,temp16,temp24);
  iVar7 = scale_expansion_zeroelim(iVar6,temp24,b_02,temp48);
  iVar7 = scale_expansion_zeroelim(iVar7,temp48,-b_02,xdet);
  iVar8 = scale_expansion_zeroelim(iVar6,temp24,b_04,temp48);
  iVar8 = scale_expansion_zeroelim(iVar8,temp48,-b_04,ydet);
  dVar12 = auVar3._8_8_;
  iVar6 = scale_expansion_zeroelim(iVar6,temp24,dVar12,temp48);
  iVar6 = scale_expansion_zeroelim(iVar6,temp48,-dVar12,zdet);
  iVar7 = fast_expansion_sum_zeroelim(iVar7,xdet,iVar8,ydet,xydet);
  iVar6 = fast_expansion_sum_zeroelim(iVar7,xydet,iVar6,zdet,adet);
  iVar7 = scale_expansion_zeroelim(4,&local_7f58,dVar42,temp8a);
  iVar8 = scale_expansion_zeroelim(4,&local_7f78,dVar32,temp8b);
  iVar9 = scale_expansion_zeroelim(4,&local_7e38,dVar12,temp8c);
  iVar7 = fast_expansion_sum_zeroelim(iVar7,temp8a,iVar8,temp8b,temp16);
  iVar7 = fast_expansion_sum_zeroelim(iVar9,temp8c,iVar7,temp16,temp24);
  iVar8 = scale_expansion_zeroelim(iVar7,temp24,b_01,temp48);
  iVar8 = scale_expansion_zeroelim(iVar8,temp48,b_01,xdet);
  iVar9 = scale_expansion_zeroelim(iVar7,temp24,b_03,temp48);
  iVar9 = scale_expansion_zeroelim(iVar9,temp48,b_03,ydet);
  iVar7 = scale_expansion_zeroelim(iVar7,temp24,dVar28,temp48);
  iVar7 = scale_expansion_zeroelim(iVar7,temp48,dVar28,zdet);
  iVar8 = fast_expansion_sum_zeroelim(iVar8,xdet,iVar9,ydet,xydet);
  iVar7 = fast_expansion_sum_zeroelim(iVar8,xydet,iVar7,zdet,bdet);
  iVar8 = scale_expansion_zeroelim(4,&local_7f38,dVar32,temp8a);
  iVar9 = scale_expansion_zeroelim(4,(double *)local_7e58,dVar12,temp8b);
  iVar10 = scale_expansion_zeroelim(4,&local_7f58,dVar28,temp8c);
  iVar8 = fast_expansion_sum_zeroelim(iVar8,temp8a,iVar9,temp8b,temp16);
  iVar8 = fast_expansion_sum_zeroelim(iVar10,temp8c,iVar8,temp16,temp24);
  iVar9 = scale_expansion_zeroelim(iVar8,temp24,b_05,temp48);
  iVar9 = scale_expansion_zeroelim(iVar9,temp48,-b_05,xdet);
  iVar10 = scale_expansion_zeroelim(iVar8,temp24,b_06,temp48);
  iVar10 = scale_expansion_zeroelim(iVar10,temp48,-b_06,ydet);
  iVar8 = scale_expansion_zeroelim(iVar8,temp24,dVar42,temp48);
  iVar8 = scale_expansion_zeroelim(iVar8,temp48,local_8148,zdet);
  iVar9 = fast_expansion_sum_zeroelim(iVar9,xdet,iVar10,ydet,xydet);
  iVar8 = fast_expansion_sum_zeroelim(iVar9,xydet,iVar8,zdet,cdet);
  iVar9 = scale_expansion_zeroelim(4,(double *)local_7e18,dVar12,temp8a);
  local_8208 = -dVar28;
  iVar10 = scale_expansion_zeroelim(4,&local_7f78,-dVar28,temp8b);
  iVar11 = scale_expansion_zeroelim(4,&local_7f38,dVar42,temp8c);
  iVar9 = fast_expansion_sum_zeroelim(iVar9,temp8a,iVar10,temp8b,temp16);
  iVar9 = fast_expansion_sum_zeroelim(iVar11,temp8c,iVar9,temp16,temp24);
  iVar10 = scale_expansion_zeroelim(iVar9,temp24,b,temp48);
  iVar10 = scale_expansion_zeroelim(iVar10,temp48,b,xdet);
  iVar11 = scale_expansion_zeroelim(iVar9,temp24,b_00,temp48);
  iVar11 = scale_expansion_zeroelim(iVar11,temp48,b_00,ydet);
  iVar9 = scale_expansion_zeroelim(iVar9,temp24,dVar32,temp48);
  iVar9 = scale_expansion_zeroelim(iVar9,temp48,dVar32,zdet);
  iVar10 = fast_expansion_sum_zeroelim(iVar10,xdet,iVar11,ydet,xydet);
  iVar9 = fast_expansion_sum_zeroelim(iVar10,xydet,iVar9,zdet,ddet);
  iVar6 = fast_expansion_sum_zeroelim(iVar6,adet,iVar7,bdet,abdet);
  iVar7 = fast_expansion_sum_zeroelim(iVar8,cdet,iVar9,ddet,cddet);
  iVar6 = fast_expansion_sum_zeroelim(iVar6,abdet,iVar7,cddet,fin1);
  dVar15 = estimate(iVar6,fin1);
  if ((dVar15 < isperrboundB * permanent) && (-dVar15 < isperrboundB * permanent)) {
    dStack_8000 = auVar25._8_8_;
    dVar17 = (dVar38 - (b_01 + (dVar38 - b_01))) + ((dVar38 - b_01) - dVar64);
    dVar20 = (dVar51 - (b_02 + (dVar51 - b_02))) + ((dVar51 - b_02) - dStack_8000);
    dVar43 = (dVar47 - (b_03 + (dVar47 - b_03))) + ((dVar47 - b_03) - dVar39);
    dVar27 = (dVar54 - (b_04 + (dVar54 - b_04))) + ((dVar54 - b_04) - dVar39);
    dVar47 = (dVar37 - (dVar28 + (dVar37 - dVar28))) + ((dVar37 - dVar28) - dVar26);
    dVar51 = (dVar16 - (dVar12 + (dVar16 - dVar12))) + ((dVar16 - dVar12) - dVar26);
    dVar16 = (dVar36 - (b + (dVar36 - b))) + ((dVar36 - b) - dVar64);
    dVar64 = (dVar59 - (b_05 + (dVar59 - b_05))) + ((dVar59 - b_05) - dStack_8000);
    dVar36 = (dVar57 - (b_00 + (dVar57 - b_00))) + ((dVar57 - b_00) - dVar39);
    dVar38 = (dVar61 - (b_06 + (dVar61 - b_06))) + ((dVar61 - b_06) - dVar39);
    dVar54 = (dVar40 - (dVar32 + (dVar40 - dVar32))) + ((dVar40 - dVar32) - dVar26);
    dVar57 = (dVar23 - (dVar42 + (dVar23 - dVar42))) + ((dVar23 - dVar42) - dVar26);
    auVar13._8_8_ = -(ulong)(dVar27 != 0.0);
    auVar13._0_8_ = -(ulong)(dVar20 != 0.0);
    auVar4._8_8_ = -(ulong)(dVar17 != 0.0);
    auVar4._0_8_ = -(ulong)(dVar51 != 0.0);
    auVar14 = packssdw(auVar13,auVar4);
    auVar24._8_8_ = -(ulong)(dVar47 != 0.0);
    auVar24._0_8_ = -(ulong)(dVar43 != 0.0);
    auVar5._8_8_ = -(ulong)(dVar38 != 0.0);
    auVar5._0_8_ = -(ulong)(dVar64 != 0.0);
    auVar25 = packssdw(auVar24,auVar5);
    auVar14 = packssdw(auVar14,auVar25);
    if (((((((((((((((((((auVar14 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                        (auVar14 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar14 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar14 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar14 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar14 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar14 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar14 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar14 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar14 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar14 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar14 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar14 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar14 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar14 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           auVar14[0xf] < '\0') ||
         ((((dVar57 != 0.0 || (NAN(dVar57))) || (dVar16 != 0.0)) ||
          ((NAN(dVar16) || (dVar36 != 0.0)))))) || (NAN(dVar36))) ||
       ((dVar54 != 0.0 || (NAN(dVar54))))) {
      dVar23 = permanent * isperrboundC + ABS(dVar15) * resulterrbound;
      dVar37 = (b_05 * dVar36 + dVar64 * b_00) - (b_06 * dVar16 + dVar38 * b);
      dVar40 = (b_01 * dVar38 + dVar17 * b_06) - (b_03 * dVar64 + dVar43 * b_05);
      dVar59 = (b_02 * dVar43 + dVar20 * b_03) - (b_04 * dVar17 + dVar27 * b_01);
      dVar61 = (b * dVar27 + dVar16 * b_04) - (b_00 * dVar20 + dVar36 * b_02);
      dVar26 = (b_01 * dVar36 + dVar17 * b_00) - (b_03 * dVar16 + b * dVar43);
      dVar39 = (b_02 * dVar38 + dVar20 * b_06) - (b_04 * dVar64 + b_05 * dVar27);
      dVar36 = ((dVar42 * dVar18 + dVar49 * dVar12 + local_8208 * dVar19) *
                (dVar32 * dVar54 + b * dVar16 + b_00 * dVar36) +
               (dVar45 * dVar12 + dVar22 * dVar42 + dVar32 * dVar19) *
               (dVar28 * dVar47 + b_01 * dVar17 + b_03 * dVar43)) -
               ((dVar28 * dVar22 + dVar18 * dVar32 + dVar12 * dVar21) *
                (dVar42 * dVar57 + b_05 * dVar64 + b_06 * dVar38) +
               (dVar49 * dVar32 + dVar45 * dVar28 + local_8148 * dVar21) *
               (dVar12 * dVar51 + b_02 * dVar20 + b_04 * dVar27));
      dVar15 = dVar36 + dVar36 +
               (((dVar57 * dVar18 + dVar51 * dVar49 + -dVar47 * dVar19 +
                 dVar59 * dVar42 + dVar40 * dVar12 + dVar39 * local_8208) *
                 (dVar32 * dVar32 + b * b + b_00 * b_00) +
                (dVar51 * dVar45 + dVar57 * dVar22 + dVar54 * dVar19 +
                dVar12 * dVar37 + dVar61 * dVar42 + dVar32 * dVar39) *
                (dVar28 * dVar28 + b_01 * b_01 + b_03 * b_03)) -
               ((dVar47 * dVar22 + dVar54 * dVar18 + dVar51 * dVar21 +
                dVar61 * dVar28 + dVar59 * dVar32 + dVar26 * dVar12) *
                (dVar42 * dVar42 + b_05 * b_05 + b_06 * b_06) +
               (dVar54 * dVar49 + dVar47 * dVar45 + -dVar57 * dVar21 +
               dVar32 * dVar40 + dVar37 * dVar28 + local_8148 * dVar26) *
               (dVar12 * dVar12 + b_02 * b_02 + b_04 * b_04))) + dVar15;
      if ((dVar15 < dVar23) && (-dVar15 < dVar23)) {
        dVar36 = insphereexact(pa,pb,pc,pd,pe);
        return dVar36;
      }
    }
  }
  return dVar15;
}

Assistant:

REAL insphereadapt(REAL *pa, REAL *pb, REAL *pc, REAL *pd, REAL *pe,
                   REAL permanent)
{
  INEXACT REAL aex, bex, cex, dex, aey, bey, cey, dey, aez, bez, cez, dez;
  REAL det, errbound;

  INEXACT REAL aexbey1, bexaey1, bexcey1, cexbey1;
  INEXACT REAL cexdey1, dexcey1, dexaey1, aexdey1;
  INEXACT REAL aexcey1, cexaey1, bexdey1, dexbey1;
  REAL aexbey0, bexaey0, bexcey0, cexbey0;
  REAL cexdey0, dexcey0, dexaey0, aexdey0;
  REAL aexcey0, cexaey0, bexdey0, dexbey0;
  REAL ab[4], bc[4], cd[4], da[4], ac[4], bd[4];
  INEXACT REAL ab3, bc3, cd3, da3, ac3, bd3;
  REAL abeps, bceps, cdeps, daeps, aceps, bdeps;
  REAL temp8a[8], temp8b[8], temp8c[8], temp16[16], temp24[24], temp48[48];
  int temp8alen, temp8blen, temp8clen, temp16len, temp24len, temp48len;
  REAL xdet[96], ydet[96], zdet[96], xydet[192];
  int xlen, ylen, zlen, xylen;
  REAL adet[288], bdet[288], cdet[288], ddet[288];
  int alen, blen, clen, dlen;
  REAL abdet[576], cddet[576];
  int ablen, cdlen;
  REAL fin1[1152];
  int finlength;

  REAL aextail, bextail, cextail, dextail;
  REAL aeytail, beytail, ceytail, deytail;
  REAL aeztail, beztail, ceztail, deztail;

  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  INEXACT REAL c;
  INEXACT REAL abig;
  REAL ahi, alo, bhi, blo;
  REAL err1, err2, err3;
  INEXACT REAL _i, _j;
  REAL _0;


  aex = (REAL) (pa[0] - pe[0]);
  bex = (REAL) (pb[0] - pe[0]);
  cex = (REAL) (pc[0] - pe[0]);
  dex = (REAL) (pd[0] - pe[0]);
  aey = (REAL) (pa[1] - pe[1]);
  bey = (REAL) (pb[1] - pe[1]);
  cey = (REAL) (pc[1] - pe[1]);
  dey = (REAL) (pd[1] - pe[1]);
  aez = (REAL) (pa[2] - pe[2]);
  bez = (REAL) (pb[2] - pe[2]);
  cez = (REAL) (pc[2] - pe[2]);
  dez = (REAL) (pd[2] - pe[2]);

  Two_Product(aex, bey, aexbey1, aexbey0);
  Two_Product(bex, aey, bexaey1, bexaey0);
  Two_Two_Diff(aexbey1, aexbey0, bexaey1, bexaey0, ab3, ab[2], ab[1], ab[0]);
  ab[3] = ab3;

  Two_Product(bex, cey, bexcey1, bexcey0);
  Two_Product(cex, bey, cexbey1, cexbey0);
  Two_Two_Diff(bexcey1, bexcey0, cexbey1, cexbey0, bc3, bc[2], bc[1], bc[0]);
  bc[3] = bc3;

  Two_Product(cex, dey, cexdey1, cexdey0);
  Two_Product(dex, cey, dexcey1, dexcey0);
  Two_Two_Diff(cexdey1, cexdey0, dexcey1, dexcey0, cd3, cd[2], cd[1], cd[0]);
  cd[3] = cd3;

  Two_Product(dex, aey, dexaey1, dexaey0);
  Two_Product(aex, dey, aexdey1, aexdey0);
  Two_Two_Diff(dexaey1, dexaey0, aexdey1, aexdey0, da3, da[2], da[1], da[0]);
  da[3] = da3;

  Two_Product(aex, cey, aexcey1, aexcey0);
  Two_Product(cex, aey, cexaey1, cexaey0);
  Two_Two_Diff(aexcey1, aexcey0, cexaey1, cexaey0, ac3, ac[2], ac[1], ac[0]);
  ac[3] = ac3;

  Two_Product(bex, dey, bexdey1, bexdey0);
  Two_Product(dex, bey, dexbey1, dexbey0);
  Two_Two_Diff(bexdey1, bexdey0, dexbey1, dexbey0, bd3, bd[2], bd[1], bd[0]);
  bd[3] = bd3;

  temp8alen = scale_expansion_zeroelim(4, cd, bez, temp8a);
  temp8blen = scale_expansion_zeroelim(4, bd, -cez, temp8b);
  temp8clen = scale_expansion_zeroelim(4, bc, dez, temp8c);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a,
                                          temp8blen, temp8b, temp16);
  temp24len = fast_expansion_sum_zeroelim(temp8clen, temp8c,
                                          temp16len, temp16, temp24);
  temp48len = scale_expansion_zeroelim(temp24len, temp24, aex, temp48);
  xlen = scale_expansion_zeroelim(temp48len, temp48, -aex, xdet);
  temp48len = scale_expansion_zeroelim(temp24len, temp24, aey, temp48);
  ylen = scale_expansion_zeroelim(temp48len, temp48, -aey, ydet);
  temp48len = scale_expansion_zeroelim(temp24len, temp24, aez, temp48);
  zlen = scale_expansion_zeroelim(temp48len, temp48, -aez, zdet);
  xylen = fast_expansion_sum_zeroelim(xlen, xdet, ylen, ydet, xydet);
  alen = fast_expansion_sum_zeroelim(xylen, xydet, zlen, zdet, adet);

  temp8alen = scale_expansion_zeroelim(4, da, cez, temp8a);
  temp8blen = scale_expansion_zeroelim(4, ac, dez, temp8b);
  temp8clen = scale_expansion_zeroelim(4, cd, aez, temp8c);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a,
                                          temp8blen, temp8b, temp16);
  temp24len = fast_expansion_sum_zeroelim(temp8clen, temp8c,
                                          temp16len, temp16, temp24);
  temp48len = scale_expansion_zeroelim(temp24len, temp24, bex, temp48);
  xlen = scale_expansion_zeroelim(temp48len, temp48, bex, xdet);
  temp48len = scale_expansion_zeroelim(temp24len, temp24, bey, temp48);
  ylen = scale_expansion_zeroelim(temp48len, temp48, bey, ydet);
  temp48len = scale_expansion_zeroelim(temp24len, temp24, bez, temp48);
  zlen = scale_expansion_zeroelim(temp48len, temp48, bez, zdet);
  xylen = fast_expansion_sum_zeroelim(xlen, xdet, ylen, ydet, xydet);
  blen = fast_expansion_sum_zeroelim(xylen, xydet, zlen, zdet, bdet);

  temp8alen = scale_expansion_zeroelim(4, ab, dez, temp8a);
  temp8blen = scale_expansion_zeroelim(4, bd, aez, temp8b);
  temp8clen = scale_expansion_zeroelim(4, da, bez, temp8c);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a,
                                          temp8blen, temp8b, temp16);
  temp24len = fast_expansion_sum_zeroelim(temp8clen, temp8c,
                                          temp16len, temp16, temp24);
  temp48len = scale_expansion_zeroelim(temp24len, temp24, cex, temp48);
  xlen = scale_expansion_zeroelim(temp48len, temp48, -cex, xdet);
  temp48len = scale_expansion_zeroelim(temp24len, temp24, cey, temp48);
  ylen = scale_expansion_zeroelim(temp48len, temp48, -cey, ydet);
  temp48len = scale_expansion_zeroelim(temp24len, temp24, cez, temp48);
  zlen = scale_expansion_zeroelim(temp48len, temp48, -cez, zdet);
  xylen = fast_expansion_sum_zeroelim(xlen, xdet, ylen, ydet, xydet);
  clen = fast_expansion_sum_zeroelim(xylen, xydet, zlen, zdet, cdet);

  temp8alen = scale_expansion_zeroelim(4, bc, aez, temp8a);
  temp8blen = scale_expansion_zeroelim(4, ac, -bez, temp8b);
  temp8clen = scale_expansion_zeroelim(4, ab, cez, temp8c);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a,
                                          temp8blen, temp8b, temp16);
  temp24len = fast_expansion_sum_zeroelim(temp8clen, temp8c,
                                          temp16len, temp16, temp24);
  temp48len = scale_expansion_zeroelim(temp24len, temp24, dex, temp48);
  xlen = scale_expansion_zeroelim(temp48len, temp48, dex, xdet);
  temp48len = scale_expansion_zeroelim(temp24len, temp24, dey, temp48);
  ylen = scale_expansion_zeroelim(temp48len, temp48, dey, ydet);
  temp48len = scale_expansion_zeroelim(temp24len, temp24, dez, temp48);
  zlen = scale_expansion_zeroelim(temp48len, temp48, dez, zdet);
  xylen = fast_expansion_sum_zeroelim(xlen, xdet, ylen, ydet, xydet);
  dlen = fast_expansion_sum_zeroelim(xylen, xydet, zlen, zdet, ddet);

  ablen = fast_expansion_sum_zeroelim(alen, adet, blen, bdet, abdet);
  cdlen = fast_expansion_sum_zeroelim(clen, cdet, dlen, ddet, cddet);
  finlength = fast_expansion_sum_zeroelim(ablen, abdet, cdlen, cddet, fin1);

  det = estimate(finlength, fin1);
  errbound = isperrboundB * permanent;
  if ((det >= errbound) || (-det >= errbound)) {
    return det;
  }

  Two_Diff_Tail(pa[0], pe[0], aex, aextail);
  Two_Diff_Tail(pa[1], pe[1], aey, aeytail);
  Two_Diff_Tail(pa[2], pe[2], aez, aeztail);
  Two_Diff_Tail(pb[0], pe[0], bex, bextail);
  Two_Diff_Tail(pb[1], pe[1], bey, beytail);
  Two_Diff_Tail(pb[2], pe[2], bez, beztail);
  Two_Diff_Tail(pc[0], pe[0], cex, cextail);
  Two_Diff_Tail(pc[1], pe[1], cey, ceytail);
  Two_Diff_Tail(pc[2], pe[2], cez, ceztail);
  Two_Diff_Tail(pd[0], pe[0], dex, dextail);
  Two_Diff_Tail(pd[1], pe[1], dey, deytail);
  Two_Diff_Tail(pd[2], pe[2], dez, deztail);
  if ((aextail == 0.0) && (aeytail == 0.0) && (aeztail == 0.0)
      && (bextail == 0.0) && (beytail == 0.0) && (beztail == 0.0)
      && (cextail == 0.0) && (ceytail == 0.0) && (ceztail == 0.0)
      && (dextail == 0.0) && (deytail == 0.0) && (deztail == 0.0)) {
    return det;
  }

  errbound = isperrboundC * permanent + resulterrbound * Absolute(det);
  abeps = (aex * beytail + bey * aextail)
        - (aey * bextail + bex * aeytail);
  bceps = (bex * ceytail + cey * bextail)
        - (bey * cextail + cex * beytail);
  cdeps = (cex * deytail + dey * cextail)
        - (cey * dextail + dex * ceytail);
  daeps = (dex * aeytail + aey * dextail)
        - (dey * aextail + aex * deytail);
  aceps = (aex * ceytail + cey * aextail)
        - (aey * cextail + cex * aeytail);
  bdeps = (bex * deytail + dey * bextail)
        - (bey * dextail + dex * beytail);
  det += (((bex * bex + bey * bey + bez * bez)
           * ((cez * daeps + dez * aceps + aez * cdeps)
              + (ceztail * da3 + deztail * ac3 + aeztail * cd3))
           + (dex * dex + dey * dey + dez * dez)
           * ((aez * bceps - bez * aceps + cez * abeps)
              + (aeztail * bc3 - beztail * ac3 + ceztail * ab3)))
          - ((aex * aex + aey * aey + aez * aez)
           * ((bez * cdeps - cez * bdeps + dez * bceps)
              + (beztail * cd3 - ceztail * bd3 + deztail * bc3))
           + (cex * cex + cey * cey + cez * cez)
           * ((dez * abeps + aez * bdeps + bez * daeps)
              + (deztail * ab3 + aeztail * bd3 + beztail * da3))))
       + 2.0 * (((bex * bextail + bey * beytail + bez * beztail)
                 * (cez * da3 + dez * ac3 + aez * cd3)
                 + (dex * dextail + dey * deytail + dez * deztail)
                 * (aez * bc3 - bez * ac3 + cez * ab3))
                - ((aex * aextail + aey * aeytail + aez * aeztail)
                 * (bez * cd3 - cez * bd3 + dez * bc3)
                 + (cex * cextail + cey * ceytail + cez * ceztail)
                 * (dez * ab3 + aez * bd3 + bez * da3)));
  if ((det >= errbound) || (-det >= errbound)) {
    return det;
  }

  return insphereexact(pa, pb, pc, pd, pe);
}